

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_ApproximateModifiedEquivalencyTest_Test::
TestBody(MessageDifferencerTest_ApproximateModifiedEquivalencyTest_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar2;
  char *in_R9;
  float v2;
  float v1;
  TestAllTypes msg2;
  TestAllTypes msg1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_6d8;
  Message local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6c8;
  AssertHelper local_6c0;
  undefined1 local_6b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a8;
  float local_698;
  float local_694;
  TestAllTypes local_690;
  TestAllTypes local_350;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&local_350,(Arena *)0x0);
  proto2_unittest::TestAllTypes::TestAllTypes(&local_690,(Arena *)0x0);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&local_350);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&local_690);
  local_694 = 2.300005;
  local_698 = 2.300006;
  local_350.field_0._impl_.optional_float_ = 2.300005;
  local_350.field_0._impl_._has_bits_.has_bits_[0]._2_1_ =
       local_350.field_0._impl_._has_bits_.has_bits_[0]._2_1_ | 0x20;
  local_690.field_0._impl_.optional_float_ = 2.300006;
  local_690.field_0._impl_._has_bits_.has_bits_[0]._2_1_ =
       local_690.field_0._impl_._has_bits_.has_bits_[0]._2_1_ | 0x20;
  testing::internal::CmpHelperNE<float,float>((internal *)local_6b8,"v1","v2",&local_694,&local_698)
  ;
  if (local_6b8[0] == (internal)0x0) {
    testing::Message::Message(&local_6d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT71(local_6d0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_6d0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) + 0x10),"Should not be the same: ",0x18);
    std::ostream::_M_insert<double>((double)local_694);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT71(local_6d0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_6d0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) + 0x10),", ",2);
    std::ostream::_M_insert<double>((double)local_698);
    if (local_6b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_6b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x3a2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_6d8,&local_6d0);
LAB_00b76aa2:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6d8);
    if ((long *)CONCAT71(local_6d0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_6d0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_6d0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_6d0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
    if (local_6b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b76ace;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_6b0;
  }
  else {
    if (local_6b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6b0,local_6b0);
    }
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)local_6b8,"v1","v2",2.300005,2.300006);
    if (local_6b8[0] == (internal)0x0) {
      testing::Message::Message(&local_6d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (CONCAT71(local_6d0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_6d0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) + 0x10),"Should be approx. equal: ",0x19);
      std::ostream::_M_insert<double>((double)local_694);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (CONCAT71(local_6d0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_6d0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) + 0x10),", ",2);
      std::ostream::_M_insert<double>((double)local_698);
      if (local_6b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar2 = (local_6b0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_6d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                 ,0x3a3,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_6d8,&local_6d0);
      goto LAB_00b76aa2;
    }
    if (local_6b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6b0,local_6b0);
    }
    bVar1 = util::MessageDifferencer::Equals(&local_350.super_Message,&local_690.super_Message);
    local_6d0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)!bVar1;
    local_6c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_6d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_6b8,(internal *)&local_6d0,
                 (AssertionResult *)"util::MessageDifferencer::Equals(msg1, msg2)","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_6c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                 ,0x3a4,(char *)CONCAT71(local_6b8._1_7_,local_6b8[0]));
      testing::internal::AssertHelper::operator=(&local_6c0,(Message *)&local_6d8);
      testing::internal::AssertHelper::~AssertHelper(&local_6c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_6b8._1_7_,local_6b8[0]) != &local_6a8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_6b8._1_7_,local_6b8[0]),
                        local_6a8._M_allocated_capacity + 1);
      }
      if (local_6d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_6d8._M_head_impl + 8))();
      }
      if (local_6c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_6c8,local_6c8);
      }
    }
    local_6d0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ =
         (internal)
         util::MessageDifferencer::ApproximatelyEquivalent
                   (&local_350.super_Message,&local_690.super_Message);
    local_6c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_6d0.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) {
      testing::Message::Message((Message *)&local_6d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_6b8,(internal *)&local_6d0,
                 (AssertionResult *)"util::MessageDifferencer::ApproximatelyEquivalent(msg1, msg2)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_6c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                 ,0x3a5,(char *)CONCAT71(local_6b8._1_7_,local_6b8[0]));
      testing::internal::AssertHelper::operator=(&local_6c0,(Message *)&local_6d8);
      testing::internal::AssertHelper::~AssertHelper(&local_6c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_6b8._1_7_,local_6b8[0]) != &local_6a8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_6b8._1_7_,local_6b8[0]),
                        local_6a8._M_allocated_capacity + 1);
      }
      if (local_6d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_6d8._M_head_impl + 8))();
      }
      if (local_6c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_6c8,local_6c8);
      }
    }
    local_350.field_0._impl_.optional_int32_ = 0;
    local_350.field_0._impl_._has_bits_.has_bits_[0]._1_1_ =
         local_350.field_0._impl_._has_bits_.has_bits_[0]._1_1_ & 0xef;
    local_690.field_0._impl_.optional_int32_ = 0;
    local_690.field_0._impl_._has_bits_.has_bits_[0]._1_1_ =
         local_690.field_0._impl_._has_bits_.has_bits_[0]._1_1_ | 0x10;
    bVar1 = util::MessageDifferencer::Equals(&local_350.super_Message,&local_690.super_Message);
    local_6d0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)!bVar1;
    local_6c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_6d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_6b8,(internal *)&local_6d0,
                 (AssertionResult *)"util::MessageDifferencer::Equals(msg1, msg2)","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_6c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                 ,0x3ac,(char *)CONCAT71(local_6b8._1_7_,local_6b8[0]));
      testing::internal::AssertHelper::operator=(&local_6c0,(Message *)&local_6d8);
      testing::internal::AssertHelper::~AssertHelper(&local_6c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_6b8._1_7_,local_6b8[0]) != &local_6a8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_6b8._1_7_,local_6b8[0]),
                        local_6a8._M_allocated_capacity + 1);
      }
      if (local_6d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_6d8._M_head_impl + 8))();
      }
      if (local_6c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_6c8,local_6c8);
      }
    }
    bVar1 = util::MessageDifferencer::Equivalent(&local_350.super_Message,&local_690.super_Message);
    local_6d0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)!bVar1;
    local_6c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_6d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_6b8,(internal *)&local_6d0,
                 (AssertionResult *)"util::MessageDifferencer::Equivalent(msg1, msg2)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_6c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                 ,0x3ad,(char *)CONCAT71(local_6b8._1_7_,local_6b8[0]));
      testing::internal::AssertHelper::operator=(&local_6c0,(Message *)&local_6d8);
      testing::internal::AssertHelper::~AssertHelper(&local_6c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_6b8._1_7_,local_6b8[0]) != &local_6a8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_6b8._1_7_,local_6b8[0]),
                        local_6a8._M_allocated_capacity + 1);
      }
      if (local_6d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_6d8._M_head_impl + 8))();
      }
      if (local_6c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_6c8,local_6c8);
      }
    }
    bVar1 = util::MessageDifferencer::ApproximatelyEquals
                      (&local_350.super_Message,&local_690.super_Message);
    local_6d0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)!bVar1;
    local_6c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_6d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_6b8,(internal *)&local_6d0,
                 (AssertionResult *)"util::MessageDifferencer::ApproximatelyEquals(msg1, msg2)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_6c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                 ,0x3ae,(char *)CONCAT71(local_6b8._1_7_,local_6b8[0]));
      testing::internal::AssertHelper::operator=(&local_6c0,(Message *)&local_6d8);
      testing::internal::AssertHelper::~AssertHelper(&local_6c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_6b8._1_7_,local_6b8[0]) != &local_6a8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_6b8._1_7_,local_6b8[0]),
                        local_6a8._M_allocated_capacity + 1);
      }
      if (local_6d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_6d8._M_head_impl + 8))();
      }
      if (local_6c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_6c8,local_6c8);
      }
    }
    local_6d0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ =
         (internal)
         util::MessageDifferencer::ApproximatelyEquivalent
                   (&local_350.super_Message,&local_690.super_Message);
    local_6c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_6d0.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_) goto LAB_00b76ace;
    testing::Message::Message((Message *)&local_6d8);
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_6c8;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_6b8,(internal *)&local_6d0,
               (AssertionResult *)"util::MessageDifferencer::ApproximatelyEquivalent(msg1, msg2)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x3af,(char *)CONCAT71(local_6b8._1_7_,local_6b8[0]));
    testing::internal::AssertHelper::operator=(&local_6c0,(Message *)&local_6d8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_6b8._1_7_,local_6b8[0]) != &local_6a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_6b8._1_7_,local_6b8[0]),local_6a8._M_allocated_capacity + 1)
      ;
    }
    if (local_6d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_6d8._M_head_impl + 8))();
    }
    local_6b0 = local_6c8;
    if (local_6c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b76ace;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_6b0);
LAB_00b76ace:
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_690);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_350);
  return;
}

Assistant:

TEST(MessageDifferencerTest, ApproximateModifiedEquivalencyTest) {
  // Create the testing protos
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  TestUtil::SetAllFields(&msg1);
  TestUtil::SetAllFields(&msg2);

  // Modify the approximateness requirement
  const float v1 = 2.300005f;
  const float v2 = 2.300006f;
  msg1.set_optional_float(v1);
  msg2.set_optional_float(v2);

  // Compare
  ASSERT_NE(v1, v2) << "Should not be the same: " << v1 << ", " << v2;
  ASSERT_FLOAT_EQ(v1, v2) << "Should be approx. equal: " << v1 << ", " << v2;
  EXPECT_FALSE(util::MessageDifferencer::Equals(msg1, msg2));
  EXPECT_TRUE(util::MessageDifferencer::ApproximatelyEquivalent(msg1, msg2));

  // Modify the equivalency requirement too
  msg1.clear_optional_int32();
  msg2.set_optional_int32(0);

  // Compare. Now should only pass on ApproximatelyEquivalent
  EXPECT_FALSE(util::MessageDifferencer::Equals(msg1, msg2));
  EXPECT_FALSE(util::MessageDifferencer::Equivalent(msg1, msg2));
  EXPECT_FALSE(util::MessageDifferencer::ApproximatelyEquals(msg1, msg2));
  EXPECT_TRUE(util::MessageDifferencer::ApproximatelyEquivalent(msg1, msg2));
}